

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setTargetNamespace
          (XMLSchemaDescriptionImpl *this,XMLCh *newNamespace)

{
  short *psVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  if (this->fNamespace != (XMLCh *)0x0) {
    (*((this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr)->_vptr_MemoryManager
      [4])();
    this->fNamespace = (XMLCh *)0x0;
  }
  if (newNamespace == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    pMVar2 = (this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr;
    __n = 0;
    do {
      psVar1 = (short *)((long)newNamespace + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(__dest,newNamespace,__n);
  }
  this->fNamespace = __dest;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setTargetNamespace(const XMLCh* const newNamespace)
{  
    if (fNamespace) {
        XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);
        fNamespace = 0;
    }
    
    fNamespace = XMLString::replicate(newNamespace, XMLGrammarDescription::getMemoryManager()); 
}